

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestCoverageHandler.cxx
# Opt level: O0

int __thiscall
cmCTestCoverageHandler::RunBullseyeCommand
          (cmCTestCoverageHandler *this,cmCTestCoverageHandlerContainer *cont,char *cmd,char *arg,
          string *outputFile)

{
  bool bVar1;
  int iVar2;
  ulong uVar3;
  ostream *poVar4;
  char *pcVar5;
  cmCTest *pcVar6;
  string local_7a0 [32];
  undefined1 local_780 [8];
  ostringstream cmCTestLog_msg_3;
  string local_608 [8];
  string stderrFile;
  undefined1 local_5c8 [8];
  string stdoutFile;
  cmCTestRunProcess runCoverageSrc;
  undefined1 local_538 [8];
  ostringstream cmCTestLog_msg_2;
  string local_3c0 [32];
  undefined1 local_3a0 [8];
  ostringstream cmCTestLog_msg_1;
  string local_220 [32];
  undefined1 local_200 [8];
  ostringstream cmCTestLog_msg;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_78;
  undefined1 local_58 [8];
  string program;
  string *outputFile_local;
  char *arg_local;
  char *cmd_local;
  cmCTestCoverageHandlerContainer *cont_local;
  cmCTestCoverageHandler *this_local;
  
  local_78.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  program.field_2._8_8_ = outputFile;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_78);
  cmsys::SystemTools::FindProgram((string *)local_58,cmd,&local_78,false);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_78);
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    if (arg == (char *)0x0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_538);
      poVar4 = std::operator<<((ostream *)local_538,"Run : ");
      poVar4 = std::operator<<(poVar4,(string *)local_58);
      std::operator<<(poVar4,"\n");
      pcVar6 = (this->super_cmCTestGenericHandler).CTest;
      std::__cxx11::ostringstream::str();
      pcVar5 = (char *)std::__cxx11::string::c_str();
      cmCTest::Log(pcVar6,5,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                   ,0x79a,pcVar5,(bool)((this->super_cmCTestGenericHandler).Quiet & 1));
      std::__cxx11::string::~string((string *)&runCoverageSrc.TimeOut);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_538);
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3a0);
      poVar4 = std::operator<<((ostream *)local_3a0,"Run : ");
      poVar4 = std::operator<<(poVar4,(string *)local_58);
      poVar4 = std::operator<<(poVar4," ");
      poVar4 = std::operator<<(poVar4,arg);
      std::operator<<(poVar4,"\n");
      pcVar6 = (this->super_cmCTestGenericHandler).CTest;
      std::__cxx11::ostringstream::str();
      pcVar5 = (char *)std::__cxx11::string::c_str();
      cmCTest::Log(pcVar6,5,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                   ,0x797,pcVar5,(bool)((this->super_cmCTestGenericHandler).Quiet & 1));
      std::__cxx11::string::~string(local_3c0);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3a0);
    }
    cmCTestRunProcess::cmCTestRunProcess((cmCTestRunProcess *)((long)&stdoutFile.field_2 + 8));
    pcVar5 = (char *)std::__cxx11::string::c_str();
    cmCTestRunProcess::SetCommand((cmCTestRunProcess *)((long)&stdoutFile.field_2 + 8),pcVar5);
    cmCTestRunProcess::AddArgument((cmCTestRunProcess *)((long)&stdoutFile.field_2 + 8),arg);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_5c8,
                   &cont->BinaryDir,"/Testing/Temporary/");
    pcVar6 = cmCTestGenericHandler::GetCTestInstance(&this->super_cmCTestGenericHandler);
    cmCTest::GetCurrentTag_abi_cxx11_((string *)((long)&stderrFile.field_2 + 8),pcVar6);
    std::__cxx11::string::operator+=
              ((string *)local_5c8,(string *)(stderrFile.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)(stderrFile.field_2._M_local_buf + 8));
    std::__cxx11::string::operator+=((string *)local_5c8,"-");
    std::__cxx11::string::operator+=((string *)local_5c8,cmd);
    std::__cxx11::string::string(local_608,(string *)local_5c8);
    std::__cxx11::string::operator+=((string *)local_5c8,".stdout");
    std::__cxx11::string::operator+=(local_608,".stderr");
    pcVar5 = (char *)std::__cxx11::string::c_str();
    cmCTestRunProcess::SetStdoutFile((cmCTestRunProcess *)((long)&stdoutFile.field_2 + 8),pcVar5);
    pcVar5 = (char *)std::__cxx11::string::c_str();
    cmCTestRunProcess::SetStderrFile((cmCTestRunProcess *)((long)&stdoutFile.field_2 + 8),pcVar5);
    bVar1 = cmCTestRunProcess::StartProcess((cmCTestRunProcess *)((long)&stdoutFile.field_2 + 8));
    if (bVar1) {
      cmCTestRunProcess::WaitForExit
                ((cmCTestRunProcess *)((long)&stdoutFile.field_2 + 8),(double *)0x0);
      std::__cxx11::string::operator=((string *)program.field_2._8_8_,(string *)local_5c8);
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_780);
      poVar4 = std::operator<<((ostream *)local_780,"Could not run : ");
      poVar4 = std::operator<<(poVar4,(string *)local_58);
      poVar4 = std::operator<<(poVar4," ");
      poVar4 = std::operator<<(poVar4,arg);
      poVar4 = std::operator<<(poVar4,"\n");
      poVar4 = std::operator<<(poVar4,"kwsys process state : ");
      iVar2 = cmCTestRunProcess::GetProcessState
                        ((cmCTestRunProcess *)((long)&stdoutFile.field_2 + 8));
      std::ostream::operator<<(poVar4,iVar2);
      pcVar6 = (this->super_cmCTestGenericHandler).CTest;
      std::__cxx11::ostringstream::str();
      pcVar5 = (char *)std::__cxx11::string::c_str();
      cmCTest::Log(pcVar6,7,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                   ,0x7ad,pcVar5,false);
      std::__cxx11::string::~string(local_7a0);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_780);
    }
    this_local._4_4_ = (uint)bVar1;
    std::__cxx11::string::~string(local_608);
    std::__cxx11::string::~string((string *)local_5c8);
    cmCTestRunProcess::~cmCTestRunProcess((cmCTestRunProcess *)((long)&stdoutFile.field_2 + 8));
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_200);
    poVar4 = std::operator<<((ostream *)local_200,"Cannot find :");
    poVar4 = std::operator<<(poVar4,cmd);
    std::operator<<(poVar4,"\n");
    pcVar6 = (this->super_cmCTestGenericHandler).CTest;
    std::__cxx11::ostringstream::str();
    pcVar5 = (char *)std::__cxx11::string::c_str();
    cmCTest::Log(pcVar6,7,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                 ,0x792,pcVar5,false);
    std::__cxx11::string::~string(local_220);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_200);
    this_local._4_4_ = 0;
  }
  std::__cxx11::string::~string((string *)local_58);
  return this_local._4_4_;
}

Assistant:

int cmCTestCoverageHandler::RunBullseyeCommand(
  cmCTestCoverageHandlerContainer* cont, const char* cmd, const char* arg,
  std::string& outputFile)
{
  std::string program = cmSystemTools::FindProgram(cmd);
  if (program.empty()) {
    cmCTestLog(this->CTest, ERROR_MESSAGE, "Cannot find :" << cmd << "\n");
    return 0;
  }
  if (arg) {
    cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                       "Run : " << program << " " << arg << "\n", this->Quiet);
  } else {
    cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                       "Run : " << program << "\n", this->Quiet);
  }
  // create a process object and start it
  cmCTestRunProcess runCoverageSrc;
  runCoverageSrc.SetCommand(program.c_str());
  runCoverageSrc.AddArgument(arg);
  std::string stdoutFile = cont->BinaryDir + "/Testing/Temporary/";
  stdoutFile += this->GetCTestInstance()->GetCurrentTag();
  stdoutFile += "-";
  stdoutFile += cmd;
  std::string stderrFile = stdoutFile;
  stdoutFile += ".stdout";
  stderrFile += ".stderr";
  runCoverageSrc.SetStdoutFile(stdoutFile.c_str());
  runCoverageSrc.SetStderrFile(stderrFile.c_str());
  if (!runCoverageSrc.StartProcess()) {
    cmCTestLog(this->CTest, ERROR_MESSAGE,
               "Could not run : " << program << " " << arg << "\n"
                                  << "kwsys process state : "
                                  << runCoverageSrc.GetProcessState());
    return 0;
  }
  // since we set the output file names wait for it to end
  runCoverageSrc.WaitForExit();
  outputFile = stdoutFile;
  return 1;
}